

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall QComboBoxPrivate::connectModel(QComboBoxPrivate *this)

{
  undefined8 *puVar1;
  QAbstractItemModel *pQVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  code *local_98;
  ImplFn local_90;
  code *local_88;
  undefined8 local_80;
  Connection local_78;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->model;
  if (pQVar2 != (QAbstractItemModel *)0x0) {
    local_88 = QAbstractItemModel::dataChanged;
    lVar8 = 0;
    local_80 = 0;
    local_98 = dataChanged;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = dataChanged;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_78,(void **)pQVar2,(QObject *)&local_88,ppvVar3,
               (QSlotObjectBase *)&local_98,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QAbstractItemModel::rowsAboutToBeInserted;
    local_80 = 0;
    local_98 = updateIndexBeforeChange;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = updateIndexBeforeChange;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_70,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QAbstractItemModel::rowsInserted;
    local_80 = 0;
    local_98 = rowsInserted;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = rowsInserted;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QAbstractItemModel::rowsAboutToBeRemoved;
    local_80 = 0;
    local_98 = updateIndexBeforeChange;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = updateIndexBeforeChange;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QAbstractItemModel::rowsRemoved;
    local_80 = 0;
    local_98 = rowsRemoved;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = rowsRemoved;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_58,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QObject::destroyed;
    local_80 = 0;
    local_98 = modelDestroyed;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = modelDestroyed;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_50,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QAbstractItemModel::modelAboutToBeReset;
    local_80 = 0;
    local_98 = updateIndexBeforeChange;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = updateIndexBeforeChange;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_48,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    pQVar2 = this->model;
    local_88 = QAbstractItemModel::modelReset;
    local_80 = 0;
    local_98 = modelReset;
    local_90 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = modelReset;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_40,(void **)pQVar2,(QObject *)&local_88,ppvVar3,(QSlotObjectBase *)&local_98,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    do {
      puVar1 = (undefined8 *)(&(this->modelConnections).field_0x0 + lVar8 * 8);
      pvVar4 = (void *)*puVar1;
      uVar5 = puVar1[1];
      uVar6 = *(undefined8 *)(local_68 + lVar8 * 8 + -8);
      puVar1 = (undefined8 *)(&(this->modelConnections).field_0x0 + lVar8 * 8);
      *puVar1 = (&local_78)[lVar8].d_ptr;
      puVar1[1] = uVar6;
      (&local_78)[lVar8].d_ptr = pvVar4;
      *(undefined8 *)(local_68 + lVar8 * 8 + -8) = uVar5;
      lVar8 = lVar8 + 2;
    } while (lVar8 != 8);
    lVar8 = 0x38;
    do {
      QMetaObject::Connection::~Connection((Connection *)((long)&local_78.d_ptr + lVar8));
      lVar8 = lVar8 + -8;
    } while (lVar8 != -8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::connectModel()
{
    if (!model)
        return;

    modelConnections = {
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QComboBoxPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsAboutToBeInserted,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsInserted,
                                this, &QComboBoxPrivate::rowsInserted),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsAboutToBeRemoved,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsRemoved,
                                this, &QComboBoxPrivate::rowsRemoved),
        QObjectPrivate::connect(model, &QObject::destroyed,
                                this, &QComboBoxPrivate::modelDestroyed),
        QObjectPrivate::connect(model, &QAbstractItemModel::modelAboutToBeReset,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::modelReset,
                                this, &QComboBoxPrivate::modelReset)
    };
}